

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O1

void __thiscall cmComputeLinkDepends::DisplayFinalEntries(cmComputeLinkDepends *this)

{
  cmTarget *pcVar1;
  pointer pLVar2;
  char *__format;
  pointer pLVar3;
  
  fprintf(_stderr,"target [%s] links to:\n",(this->Target->Name)._M_dataplus._M_p);
  pLVar3 = (this->FinalLinkEntries).
           super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pLVar3 != (this->FinalLinkEntries).
                super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pcVar1 = pLVar3->Target;
      pLVar2 = (pointer)&pcVar1->Name;
      if (pcVar1 == (cmTarget *)0x0) {
        pLVar2 = pLVar3;
      }
      __format = "  target [%s]\n";
      if (pcVar1 == (cmTarget *)0x0) {
        __format = "  item [%s]\n";
      }
      fprintf(_stderr,__format,(pLVar2->Item)._M_dataplus._M_p);
      pLVar3 = pLVar3 + 1;
    } while (pLVar3 != (this->FinalLinkEntries).
                       super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void cmComputeLinkDepends::DisplayFinalEntries()
{
  fprintf(stderr, "target [%s] links to:\n", this->Target->GetName().c_str());
  for(std::vector<LinkEntry>::const_iterator lei =
        this->FinalLinkEntries.begin();
      lei != this->FinalLinkEntries.end(); ++lei)
    {
    if(lei->Target)
      {
      fprintf(stderr, "  target [%s]\n", lei->Target->GetName().c_str());
      }
    else
      {
      fprintf(stderr, "  item [%s]\n", lei->Item.c_str());
      }
    }
  fprintf(stderr, "\n");
}